

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlDocPtrWrap(xmlDocPtr doc)

{
  PyObject *ret;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    doc_local = (xmlDocPtr)&_Py_NoneStruct;
  }
  else {
    doc_local = (xmlDocPtr)PyCapsule_New(doc,"xmlDocPtr",0);
  }
  return (PyObject *)doc_local;
}

Assistant:

PyObject *
libxml_xmlDocPtrWrap(xmlDocPtr doc)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlDocPtrWrap: doc = %p\n", doc);
#endif
    if (doc == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    /* TODO: look at deallocation */
    ret = PyCapsule_New((void *) doc, (char *) "xmlDocPtr", NULL);
    return (ret);
}